

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_metric.h
# Opt level: O0

void __thiscall prometheus::ClientMetric::ClientMetric(ClientMetric *this,ClientMetric *param_1)

{
  ClientMetric *param_1_local;
  ClientMetric *this_local;
  
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  vector(&this->label,&param_1->label);
  (this->counter).value = (param_1->counter).value;
  (this->gauge).value = (param_1->gauge).value;
  (this->info).value = (param_1->info).value;
  Summary::Summary(&this->summary,&param_1->summary);
  Histogram::Histogram(&this->histogram,&param_1->histogram);
  (this->untyped).value = (param_1->untyped).value;
  this->timestamp_ms = param_1->timestamp_ms;
  return;
}

Assistant:

struct PROMETHEUS_CPP_CORE_EXPORT ClientMetric {
  // Label

  struct Label {
    std::string name;
    std::string value;

    friend bool operator<(const Label& lhs, const Label& rhs) {
      return std::tie(lhs.name, lhs.value) < std::tie(rhs.name, rhs.value);
    }

    friend bool operator==(const Label& lhs, const Label& rhs) {
      return std::tie(lhs.name, lhs.value) == std::tie(rhs.name, rhs.value);
    }
  };
  std::vector<Label> label;

  // Counter

  struct Counter {
    double value = 0.0;
  };
  Counter counter;

  // Gauge

  struct Gauge {
    double value = 0.0;
  };
  Gauge gauge;

  // Info

  struct Info {
    double value = 1.0;
  };
  Info info;

  // Summary

  struct Quantile {
    double quantile = 0.0;
    double value = 0.0;
  };

  struct Summary {
    std::uint64_t sample_count = 0;
    double sample_sum = 0.0;
    std::vector<Quantile> quantile;
  };
  Summary summary;

  // Histogram

  struct Bucket {
    std::uint64_t cumulative_count = 0;
    double upper_bound = 0.0;
  };

  struct Histogram {
    std::uint64_t sample_count = 0;
    double sample_sum = 0.0;
    std::vector<Bucket> bucket;
  };
  Histogram histogram;

  // Untyped

  struct Untyped {
    double value = 0;
  };
  Untyped untyped;

  // Timestamp

  std::int64_t timestamp_ms = 0;
}